

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bzlib.c
# Opt level: O3

int BZ2_bzDecompress(bz_stream *strm)

{
  uint *puVar1;
  byte bVar2;
  ushort uVar3;
  ushort uVar4;
  DState *s;
  UInt16 *pUVar5;
  UInt32 *pUVar6;
  int iVar7;
  int iVar8;
  uint uVar9;
  Int32 IVar10;
  long lVar11;
  Int32 na;
  Int32 IVar12;
  Int32 IVar13;
  bz_stream *pbVar14;
  Int32 na_1;
  uint uVar15;
  UChar *pUVar16;
  uint uVar17;
  uint uVar18;
  uint uVar19;
  int iVar20;
  UInt32 UVar21;
  UInt32 UVar22;
  ulong uVar23;
  Int32 na_9;
  uint uVar24;
  Int32 na_8;
  uint uVar25;
  int iVar26;
  UChar UVar27;
  Int32 na_7;
  Int32 na_6;
  
  IVar10 = -2;
  if (((strm != (bz_stream *)0x0) && (s = (DState *)strm->state, s != (DState *)0x0)) &&
     (s->strm == strm)) {
    IVar12 = s->state;
LAB_004218f5:
    do {
      if (IVar12 == 1) {
        return -1;
      }
      if (IVar12 == 2) {
        if (s->smallDecompress == '\0') {
          if (s->blockRandomised == '\0') {
            UVar21 = s->calculatedBlockCRC;
            IVar10 = s->state_out_len;
            pUVar6 = s->tt;
            uVar23 = (ulong)s->tPos;
            pUVar16 = (UChar *)s->strm->next_out;
            uVar19 = s->strm->avail_out;
            iVar20 = s->save_nblock;
            iVar8 = iVar20 + 1;
            uVar9 = s->blockSize100k * 100000;
            IVar12 = s->nblock_used;
            uVar24 = s->k0;
            uVar25 = uVar19;
            uVar15 = (uint)s->state_out_ch;
            while( true ) {
              UVar27 = (UChar)uVar15;
              UVar22 = (UInt32)uVar23;
              IVar13 = IVar12;
              uVar18 = uVar24;
              if (IVar10 < 1) goto LAB_0042251a;
              if (uVar25 == 0) break;
              lVar11 = 0;
              while (IVar10 + -1 != (int)lVar11) {
                pUVar16[lVar11] = UVar27;
                UVar21 = UVar21 << 8 ^ BZ2_crc32Table[UVar21 >> 0x18 ^ uVar15 & 0xff];
                lVar11 = lVar11 + 1;
                if (uVar25 == (uint)lVar11) {
                  pUVar16 = pUVar16 + lVar11;
                  IVar10 = IVar10 - (uint)lVar11;
                  goto LAB_0042263e;
                }
              }
              uVar25 = uVar25 - (int)lVar11;
              pUVar16 = pUVar16 + lVar11;
              uVar18 = uVar15;
              do {
                UVar27 = (UChar)uVar18;
                UVar22 = (UInt32)uVar23;
                if (uVar25 == 0) {
                  uVar25 = 0;
                  IVar10 = 1;
                  goto LAB_00422648;
                }
                *pUVar16 = UVar27;
                UVar21 = UVar21 << 8 ^ BZ2_crc32Table[uVar18 & 0xff ^ UVar21 >> 0x18];
                pUVar16 = pUVar16 + 1;
                uVar25 = uVar25 - 1;
                IVar13 = IVar12;
                uVar18 = uVar24;
LAB_0042251a:
                UVar22 = (UInt32)uVar23;
                if (IVar13 != iVar8 && iVar8 <= IVar13) {
                  return -4;
                }
                if (IVar13 == iVar8) {
                  IVar10 = 0;
                  IVar12 = iVar8;
                  uVar24 = uVar18;
                  goto LAB_00422648;
                }
                if (uVar9 <= UVar22) {
                  return -4;
                }
                uVar24 = pUVar6[uVar23] & 0xff;
                uVar15 = pUVar6[uVar23] >> 8;
                uVar23 = (ulong)uVar15;
                IVar12 = IVar13 + 1;
              } while ((uVar24 != uVar18) || (uVar24 = uVar18, IVar13 == iVar20));
              if (uVar9 <= uVar15) {
                return -4;
              }
              puVar1 = pUVar6 + uVar23;
              uVar17 = *puVar1 >> 8;
              uVar23 = (ulong)uVar17;
              IVar10 = 2;
              IVar12 = iVar8;
              uVar15 = uVar18;
              if ((IVar13 + 2 != iVar8) &&
                 (uVar24 = *puVar1 & 0xff, IVar12 = IVar13 + 2, uVar24 == uVar18)) {
                if (uVar9 <= uVar17) {
                  return -4;
                }
                puVar1 = pUVar6 + uVar23;
                uVar17 = *puVar1 >> 8;
                uVar23 = (ulong)uVar17;
                IVar10 = 3;
                IVar12 = iVar8;
                uVar24 = uVar18;
                if ((IVar13 + 3 != iVar8) &&
                   (uVar24 = *puVar1 & 0xff, IVar12 = IVar13 + 3, uVar24 == uVar18)) {
                  if (uVar9 <= uVar17) {
                    return -4;
                  }
                  uVar18 = pUVar6[uVar23] >> 8;
                  if (uVar9 <= uVar18) {
                    return -4;
                  }
                  IVar10 = (pUVar6[uVar23] & 0xff) + 4;
                  uVar24 = pUVar6[uVar18] & 0xff;
                  uVar23 = (ulong)(pUVar6[uVar18] >> 8);
                  IVar12 = IVar13 + 5;
                }
              }
            }
LAB_0042263e:
            uVar25 = 0;
LAB_00422648:
            pbVar14 = s->strm;
            uVar19 = uVar19 - uVar25;
            puVar1 = &pbVar14->total_out_lo32;
            uVar15 = *puVar1;
            *puVar1 = *puVar1 + uVar19;
            if (CARRY4(uVar15,uVar19)) {
              pbVar14->total_out_hi32 = pbVar14->total_out_hi32 + 1;
            }
            s->calculatedBlockCRC = UVar21;
            s->state_out_ch = UVar27;
            s->state_out_len = IVar10;
            s->nblock_used = IVar12;
            s->k0 = uVar24;
            s->tt = pUVar6;
            s->tPos = UVar22;
            pbVar14->next_out = (char *)pUVar16;
            pbVar14->avail_out = uVar25;
          }
          else {
            pbVar14 = s->strm;
            if (pbVar14->avail_out != 0) {
              IVar10 = s->state_out_len;
              do {
                if (IVar10 == 0) {
                  iVar8 = s->nblock_used;
                  iVar7 = s->save_nblock;
                  iVar20 = iVar7 + 1;
                  if (iVar8 == iVar20) break;
                  if (iVar8 != iVar20 && iVar20 <= iVar8) {
                    return -4;
                  }
                  s->state_out_len = 1;
                  uVar19 = s->k0;
                  s->state_out_ch = (UChar)uVar19;
                  uVar24 = s->blockSize100k * 100000;
                  if (uVar24 <= s->tPos) {
                    return -4;
                  }
                  pUVar6 = s->tt;
                  uVar25 = pUVar6[s->tPos];
                  uVar15 = uVar25 >> 8;
                  s->tPos = uVar15;
                  iVar20 = s->rNToGo;
                  if (iVar20 == 0) {
                    iVar20 = BZ2_rNums[s->rTPos];
                    IVar10 = s->rTPos + 1;
                    if (IVar10 == 0x200) {
                      IVar10 = 0;
                    }
                    s->rTPos = IVar10;
                  }
                  IVar10 = iVar20 + -1;
                  s->rNToGo = IVar10;
                  s->nblock_used = iVar8 + 1;
                  if (iVar8 != iVar7) {
                    uVar25 = uVar25 & 0xff ^ (uint)(IVar10 == 1);
                    if (uVar25 == uVar19) {
                      s->state_out_len = 2;
                      if (uVar24 <= uVar15) {
                        return -4;
                      }
                      uVar25 = pUVar6[uVar15];
                      uVar15 = uVar25 >> 8;
                      s->tPos = uVar15;
                      if (IVar10 == 0) {
                        IVar10 = BZ2_rNums[s->rTPos];
                        IVar12 = s->rTPos + 1;
                        if (IVar12 == 0x200) {
                          IVar12 = 0;
                        }
                        s->rTPos = IVar12;
                      }
                      IVar10 = IVar10 + -1;
                      s->rNToGo = IVar10;
                      s->nblock_used = iVar8 + 2;
                      if (iVar8 + 1 != iVar7) {
                        uVar25 = uVar25 & 0xff ^ (uint)(IVar10 == 1);
                        if (uVar25 == uVar19) {
                          s->state_out_len = 3;
                          if (uVar24 <= uVar15) {
                            return -4;
                          }
                          uVar25 = pUVar6[uVar15];
                          uVar15 = uVar25 >> 8;
                          s->tPos = uVar15;
                          if (IVar10 == 0) {
                            IVar10 = BZ2_rNums[s->rTPos];
                            IVar12 = s->rTPos + 1;
                            if (IVar12 == 0x200) {
                              IVar12 = 0;
                            }
                            s->rTPos = IVar12;
                          }
                          IVar10 = IVar10 + -1;
                          s->rNToGo = IVar10;
                          s->nblock_used = iVar8 + 3;
                          if (iVar8 + 2 != iVar7) {
                            uVar25 = uVar25 & 0xff ^ (uint)(IVar10 == 1);
                            if (uVar25 == uVar19) {
                              if (uVar24 <= uVar15) {
                                return -4;
                              }
                              uVar19 = pUVar6[uVar15];
                              uVar25 = uVar19 >> 8;
                              s->tPos = uVar25;
                              if (IVar10 == 0) {
                                IVar10 = BZ2_rNums[s->rTPos];
                                IVar12 = s->rTPos + 1;
                                if (IVar12 == 0x200) {
                                  IVar12 = 0;
                                }
                                s->rTPos = IVar12;
                              }
                              IVar10 = IVar10 + -1;
                              s->rNToGo = IVar10;
                              s->nblock_used = iVar8 + 4;
                              s->state_out_len = (uVar19 & 0xff ^ (uint)(IVar10 == 1)) + 4;
                              if (uVar24 <= uVar25) {
                                return -4;
                              }
                              uVar19 = pUVar6[uVar25];
                              uVar24 = uVar19 & 0xff;
                              s->k0 = uVar24;
                              s->tPos = uVar19 >> 8;
                              if (IVar10 == 0) {
                                IVar10 = BZ2_rNums[s->rTPos];
                                IVar12 = s->rTPos + 1;
                                if (IVar12 == 0x200) {
                                  IVar12 = 0;
                                }
                                s->rTPos = IVar12;
                              }
                              s->rNToGo = IVar10 + -1;
                              s->k0 = uVar24 ^ IVar10 + -1 == 1;
                              s->nblock_used = iVar8 + 5;
                            }
                            else {
                              s->k0 = uVar25;
                            }
                          }
                        }
                        else {
                          s->k0 = uVar25;
                        }
                      }
                    }
                    else {
                      s->k0 = uVar25;
                    }
                  }
                  if (pbVar14->avail_out == 0) break;
                }
                bVar2 = s->state_out_ch;
                *pbVar14->next_out = bVar2;
                s->calculatedBlockCRC =
                     s->calculatedBlockCRC << 8 ^
                     BZ2_crc32Table[s->calculatedBlockCRC >> 0x18 ^ (uint)bVar2];
                IVar10 = s->state_out_len + -1;
                s->state_out_len = IVar10;
                pbVar14 = s->strm;
                pbVar14->next_out = pbVar14->next_out + 1;
                uVar19 = pbVar14->avail_out - 1;
                pbVar14->avail_out = uVar19;
                puVar1 = &pbVar14->total_out_lo32;
                *puVar1 = *puVar1 + 1;
                if (*puVar1 == 0) {
                  pbVar14->total_out_hi32 = pbVar14->total_out_hi32 + 1;
                }
              } while (uVar19 != 0);
            }
          }
        }
        else {
          pbVar14 = s->strm;
          if (s->blockRandomised == '\0') {
            if (pbVar14->avail_out != 0) {
              IVar10 = s->state_out_len;
              do {
                if (IVar10 == 0) {
                  iVar8 = s->nblock_used;
                  iVar7 = s->save_nblock;
                  iVar20 = iVar7 + 1;
                  if (iVar8 == iVar20) break;
                  if (iVar8 != iVar20 && iVar20 <= iVar8) {
                    return -4;
                  }
                  s->state_out_len = 1;
                  uVar19 = s->tPos;
                  uVar24 = s->k0;
                  s->state_out_ch = (UChar)uVar24;
                  uVar25 = s->blockSize100k * 100000;
                  if (uVar25 <= uVar19) {
                    return -4;
                  }
                  uVar15 = 0;
                  uVar9 = 0x100;
                  do {
                    uVar17 = (int)(uVar15 + uVar9) >> 1;
                    uVar18 = uVar17;
                    if (s->cftab[(int)uVar17] <= (int)uVar19) {
                      uVar18 = uVar9;
                      uVar15 = uVar17;
                    }
                    uVar9 = uVar18;
                  } while (uVar9 - uVar15 != 1);
                  pUVar5 = s->ll16;
                  pUVar16 = s->ll4;
                  uVar3 = pUVar5[uVar19];
                  uVar19 = (pUVar16[uVar19 >> 1] >> ((char)uVar19 * '\x04' & 4U) & 0xf) << 0x10 |
                           (uint)uVar3;
                  s->tPos = uVar19;
                  s->nblock_used = iVar8 + 1;
                  if (iVar8 != iVar7) {
                    if ((uVar15 & 0xff) == uVar24) {
                      s->state_out_len = 2;
                      if (uVar25 <= uVar19) {
                        return -4;
                      }
                      uVar15 = 0;
                      uVar9 = 0x100;
                      do {
                        uVar17 = (int)(uVar15 + uVar9) >> 1;
                        uVar18 = uVar17;
                        if (s->cftab[(int)uVar17] <= (int)uVar19) {
                          uVar18 = uVar9;
                          uVar15 = uVar17;
                        }
                        uVar9 = uVar18;
                      } while (uVar9 - uVar15 != 1);
                      uVar4 = pUVar5[uVar19];
                      uVar19 = (pUVar16[uVar19 >> 1] >> (((byte)uVar3 & 1) << 2) & 0xf) << 0x10 |
                               (uint)uVar4;
                      s->tPos = uVar19;
                      s->nblock_used = iVar8 + 2;
                      if (iVar8 + 1 != iVar7) {
                        if ((uVar15 & 0xff) == uVar24) {
                          s->state_out_len = 3;
                          if (uVar25 <= uVar19) {
                            return -4;
                          }
                          uVar15 = 0;
                          uVar9 = 0x100;
                          do {
                            uVar17 = (int)(uVar15 + uVar9) >> 1;
                            uVar18 = uVar17;
                            if (s->cftab[(int)uVar17] <= (int)uVar19) {
                              uVar18 = uVar9;
                              uVar15 = uVar17;
                            }
                            uVar9 = uVar18;
                          } while (uVar9 - uVar15 != 1);
                          uVar3 = pUVar5[uVar19];
                          uVar19 = (pUVar16[uVar19 >> 1] >> (((byte)uVar4 & 1) << 2) & 0xf) << 0x10
                                   | (uint)uVar3;
                          s->tPos = uVar19;
                          s->nblock_used = iVar8 + 3;
                          if (iVar8 + 2 != iVar7) {
                            if ((uVar15 & 0xff) == uVar24) {
                              if (uVar25 <= uVar19) {
                                return -4;
                              }
                              uVar24 = 0;
                              uVar15 = 0x100;
                              do {
                                uVar18 = (int)(uVar24 + uVar15) >> 1;
                                uVar9 = uVar18;
                                if (s->cftab[(int)uVar18] <= (int)uVar19) {
                                  uVar9 = uVar15;
                                  uVar24 = uVar18;
                                }
                                uVar15 = uVar9;
                              } while (uVar15 - uVar24 != 1);
                              uVar4 = pUVar5[uVar19];
                              uVar19 = (pUVar16[uVar19 >> 1] >> (((byte)uVar3 & 1) << 2) & 0xf) <<
                                       0x10 | (uint)uVar4;
                              s->tPos = uVar19;
                              s->nblock_used = iVar8 + 4;
                              s->state_out_len = (uVar24 & 0xff) + 4;
                              if (uVar25 <= uVar19) {
                                return -4;
                              }
                              iVar20 = 0;
                              iVar7 = 0x100;
                              do {
                                iVar26 = iVar20 + iVar7 >> 1;
                                if (s->cftab[iVar26] <= (int)uVar19) {
                                  iVar20 = iVar26;
                                  iVar26 = iVar7;
                                }
                                iVar7 = iVar26;
                              } while (iVar7 - iVar20 != 1);
                              s->k0 = iVar20;
                              s->tPos = (pUVar16[uVar19 >> 1] >> (((byte)uVar4 & 1) << 2) & 0xf) <<
                                        0x10 | (uint)pUVar5[uVar19];
                              s->nblock_used = iVar8 + 5;
                            }
                            else {
                              s->k0 = uVar15 & 0xff;
                            }
                          }
                        }
                        else {
                          s->k0 = uVar15 & 0xff;
                        }
                      }
                    }
                    else {
                      s->k0 = uVar15 & 0xff;
                    }
                  }
                  if (pbVar14->avail_out == 0) break;
                }
                bVar2 = s->state_out_ch;
                *pbVar14->next_out = bVar2;
                s->calculatedBlockCRC =
                     s->calculatedBlockCRC << 8 ^
                     BZ2_crc32Table[s->calculatedBlockCRC >> 0x18 ^ (uint)bVar2];
                IVar10 = s->state_out_len + -1;
                s->state_out_len = IVar10;
                pbVar14 = s->strm;
                pbVar14->next_out = pbVar14->next_out + 1;
                uVar19 = pbVar14->avail_out - 1;
                pbVar14->avail_out = uVar19;
                puVar1 = &pbVar14->total_out_lo32;
                *puVar1 = *puVar1 + 1;
                if (*puVar1 == 0) {
                  pbVar14->total_out_hi32 = pbVar14->total_out_hi32 + 1;
                }
              } while (uVar19 != 0);
            }
          }
          else if (pbVar14->avail_out != 0) {
            IVar10 = s->state_out_len;
            do {
              if (IVar10 == 0) {
                iVar20 = s->nblock_used;
                iVar8 = s->save_nblock;
                iVar7 = iVar8 + 1;
                if (iVar20 == iVar7) break;
                if (iVar20 != iVar7 && iVar7 <= iVar20) {
                  return -4;
                }
                s->state_out_len = 1;
                uVar19 = s->tPos;
                uVar24 = s->k0;
                s->state_out_ch = (UChar)uVar24;
                uVar25 = s->blockSize100k * 100000;
                if (uVar25 <= uVar19) {
                  return -4;
                }
                uVar15 = 0;
                uVar9 = 0x100;
                do {
                  uVar18 = (int)(uVar15 + uVar9) >> 1;
                  if (s->cftab[(int)uVar18] <= (int)uVar19) {
                    uVar15 = uVar18;
                    uVar18 = uVar9;
                  }
                  uVar9 = uVar18;
                } while (uVar9 - uVar15 != 1);
                pUVar16 = s->ll4;
                pUVar5 = s->ll16;
                uVar3 = pUVar5[uVar19];
                uVar19 = (pUVar16[uVar19 >> 1] >> ((char)uVar19 * '\x04' & 4U) & 0xf) << 0x10 |
                         (uint)uVar3;
                s->tPos = uVar19;
                iVar7 = s->rNToGo;
                if (iVar7 == 0) {
                  iVar7 = BZ2_rNums[s->rTPos];
                  IVar10 = s->rTPos + 1;
                  if (IVar10 == 0x200) {
                    IVar10 = 0;
                  }
                  s->rTPos = IVar10;
                }
                IVar10 = iVar7 + -1;
                s->rNToGo = IVar10;
                s->nblock_used = iVar20 + 1;
                if (iVar20 != iVar8) {
                  uVar15 = uVar15 & 0xff ^ (uint)(IVar10 == 1);
                  if (uVar15 == uVar24) {
                    s->state_out_len = 2;
                    if (uVar25 <= uVar19) {
                      return -4;
                    }
                    uVar15 = 0;
                    uVar9 = 0x100;
                    do {
                      uVar18 = (int)(uVar15 + uVar9) >> 1;
                      if (s->cftab[(int)uVar18] <= (int)uVar19) {
                        uVar15 = uVar18;
                        uVar18 = uVar9;
                      }
                      uVar9 = uVar18;
                    } while (uVar9 - uVar15 != 1);
                    uVar4 = pUVar5[uVar19];
                    uVar19 = (pUVar16[uVar19 >> 1] >> (((byte)uVar3 & 1) << 2) & 0xf) << 0x10 |
                             (uint)uVar4;
                    s->tPos = uVar19;
                    if (IVar10 == 0) {
                      IVar10 = BZ2_rNums[s->rTPos];
                      IVar12 = s->rTPos + 1;
                      if (IVar12 == 0x200) {
                        IVar12 = 0;
                      }
                      s->rTPos = IVar12;
                    }
                    IVar10 = IVar10 + -1;
                    s->rNToGo = IVar10;
                    s->nblock_used = iVar20 + 2;
                    if (iVar20 + 1 != iVar8) {
                      uVar15 = uVar15 & 0xff ^ (uint)(IVar10 == 1);
                      if (uVar15 == uVar24) {
                        s->state_out_len = 3;
                        if (uVar25 <= uVar19) {
                          return -4;
                        }
                        uVar15 = 0;
                        uVar9 = 0x100;
                        do {
                          uVar17 = (int)(uVar15 + uVar9) >> 1;
                          uVar18 = uVar17;
                          if (s->cftab[(int)uVar17] <= (int)uVar19) {
                            uVar18 = uVar9;
                            uVar15 = uVar17;
                          }
                          uVar9 = uVar18;
                        } while (uVar9 - uVar15 != 1);
                        uVar3 = pUVar5[uVar19];
                        uVar19 = (pUVar16[uVar19 >> 1] >>
                                  (sbyte)(((ulong)uVar4 & 0x3fffffffffffffc1) << 2) & 0xf) << 0x10 |
                                 (uint)uVar3;
                        s->tPos = uVar19;
                        if (IVar10 == 0) {
                          IVar10 = BZ2_rNums[s->rTPos];
                          IVar12 = s->rTPos + 1;
                          if (IVar12 == 0x200) {
                            IVar12 = 0;
                          }
                          s->rTPos = IVar12;
                        }
                        IVar10 = IVar10 + -1;
                        s->rNToGo = IVar10;
                        s->nblock_used = iVar20 + 3;
                        if (iVar20 + 2 != iVar8) {
                          uVar15 = uVar15 & 0xff ^ (uint)(IVar10 == 1);
                          if (uVar15 != uVar24) goto LAB_00421d4f;
                          if (uVar25 <= uVar19) {
                            return -4;
                          }
                          uVar24 = 0;
                          uVar15 = 0x100;
                          do {
                            uVar18 = (int)(uVar24 + uVar15) >> 1;
                            uVar9 = uVar18;
                            if (s->cftab[(int)uVar18] <= (int)uVar19) {
                              uVar9 = uVar15;
                              uVar24 = uVar18;
                            }
                            uVar15 = uVar9;
                          } while (uVar15 - uVar24 != 1);
                          uVar4 = pUVar5[uVar19];
                          uVar19 = (pUVar16[uVar19 >> 1] >>
                                    (sbyte)(((ulong)uVar3 & 0x3fffffffffffffc1) << 2) & 0xf) << 0x10
                                   | (uint)uVar4;
                          s->tPos = uVar19;
                          if (IVar10 == 0) {
                            IVar10 = BZ2_rNums[s->rTPos];
                            IVar12 = s->rTPos + 1;
                            if (IVar12 == 0x200) {
                              IVar12 = 0;
                            }
                            s->rTPos = IVar12;
                          }
                          IVar10 = IVar10 + -1;
                          s->rNToGo = IVar10;
                          s->nblock_used = iVar20 + 4;
                          s->state_out_len = (uVar24 & 0xff ^ (uint)(IVar10 == 1)) + 4;
                          if (uVar25 <= uVar19) {
                            return -4;
                          }
                          uVar24 = 0;
                          uVar25 = 0x100;
                          do {
                            uVar15 = (int)(uVar24 + uVar25) >> 1;
                            if (s->cftab[(int)uVar15] <= (int)uVar19) {
                              uVar24 = uVar15;
                              uVar15 = uVar25;
                            }
                            uVar25 = uVar15;
                          } while (uVar25 - uVar24 != 1);
                          s->k0 = uVar24;
                          s->tPos = (pUVar16[uVar19 >> 1] >>
                                     (sbyte)(((ulong)uVar4 & 0x3fffffffffffffc1) << 2) & 0xf) <<
                                    0x10 | (uint)pUVar5[uVar19];
                          if (IVar10 == 0) {
                            IVar10 = BZ2_rNums[s->rTPos];
                            IVar12 = s->rTPos + 1;
                            if (IVar12 == 0x200) {
                              IVar12 = 0;
                            }
                            s->rTPos = IVar12;
                          }
                          s->rNToGo = IVar10 + -1;
                          s->k0 = uVar24 ^ IVar10 + -1 == 1;
                          s->nblock_used = iVar20 + 5;
                        }
                      }
                      else {
LAB_00421d4f:
                        s->k0 = uVar15;
                      }
                    }
                  }
                  else {
                    s->k0 = uVar15;
                  }
                }
                if (pbVar14->avail_out == 0) break;
              }
              bVar2 = s->state_out_ch;
              *pbVar14->next_out = bVar2;
              s->calculatedBlockCRC =
                   s->calculatedBlockCRC << 8 ^
                   BZ2_crc32Table[s->calculatedBlockCRC >> 0x18 ^ (uint)bVar2];
              IVar10 = s->state_out_len + -1;
              s->state_out_len = IVar10;
              pbVar14 = s->strm;
              pbVar14->next_out = pbVar14->next_out + 1;
              uVar19 = pbVar14->avail_out - 1;
              pbVar14->avail_out = uVar19;
              puVar1 = &pbVar14->total_out_lo32;
              *puVar1 = *puVar1 + 1;
              if (*puVar1 == 0) {
                pbVar14->total_out_hi32 = pbVar14->total_out_hi32 + 1;
              }
            } while (uVar19 != 0);
          }
        }
        if (s->nblock_used != s->save_nblock + 1) {
          return 0;
        }
        if (s->state_out_len != 0) {
          return 0;
        }
        s->calculatedBlockCRC = ~s->calculatedBlockCRC;
        iVar20 = s->verbosity;
        if (2 < iVar20) {
          fprintf(_stderr," {0x%08x, 0x%08x}",(ulong)s->storedBlockCRC);
          iVar20 = s->verbosity;
        }
        if (1 < iVar20) {
          fputc(0x5d,_stderr);
        }
        if (s->calculatedBlockCRC != s->storedBlockCRC) {
          return -4;
        }
        s->calculatedCombinedCRC =
             (s->calculatedCombinedCRC << 1 | (uint)((int)s->calculatedCombinedCRC < 0)) ^
             s->calculatedBlockCRC;
        s->state = 0xe;
      }
      else if (IVar12 < 10) goto LAB_004218f5;
      IVar10 = BZ2_decompress(s);
      if (IVar10 == 4) {
        if (2 < s->verbosity) {
          fprintf(_stderr,"\n    combined CRCs: stored = 0x%08x, computed = 0x%08x",
                  (ulong)s->storedCombinedCRC,(ulong)s->calculatedCombinedCRC);
        }
        return (uint)(s->calculatedCombinedCRC == s->storedCombinedCRC) * 8 + -4;
      }
      IVar12 = 2;
    } while (s->state == 2);
  }
  return IVar10;
}

Assistant:

int BZ_API(BZ2_bzDecompress) ( bz_stream *strm )
{
   Bool    corrupt;
   DState* s;
   if (strm == NULL) return BZ_PARAM_ERROR;
   s = (DState *)strm->state;
   if (s == NULL) return BZ_PARAM_ERROR;
   if (s->strm != strm) return BZ_PARAM_ERROR;

   while (True) {
      if (s->state == BZ_X_IDLE) return BZ_SEQUENCE_ERROR;
      if (s->state == BZ_X_OUTPUT) {
         if (s->smallDecompress)
            corrupt = unRLE_obuf_to_output_SMALL ( s ); else
            corrupt = unRLE_obuf_to_output_FAST  ( s );
         if (corrupt) return BZ_DATA_ERROR;
         if (s->nblock_used == s->save_nblock+1 && s->state_out_len == 0) {
            BZ_FINALISE_CRC ( s->calculatedBlockCRC );
            if (s->verbosity >= 3) 
               VPrintf2 ( " {0x%08x, 0x%08x}", s->storedBlockCRC, 
                          s->calculatedBlockCRC );
            if (s->verbosity >= 2) VPrintf0 ( "]" );
            if (s->calculatedBlockCRC != s->storedBlockCRC)
               return BZ_DATA_ERROR;
            s->calculatedCombinedCRC 
               = (s->calculatedCombinedCRC << 1) | 
                    (s->calculatedCombinedCRC >> 31);
            s->calculatedCombinedCRC ^= s->calculatedBlockCRC;
            s->state = BZ_X_BLKHDR_1;
         } else {
            return BZ_OK;
         }
      }
      if (s->state >= BZ_X_MAGIC_1) {
         Int32 r = BZ2_decompress ( s );
         if (r == BZ_STREAM_END) {
            if (s->verbosity >= 3)
               VPrintf2 ( "\n    combined CRCs: stored = 0x%08x, computed = 0x%08x", 
                          s->storedCombinedCRC, s->calculatedCombinedCRC );
            if (s->calculatedCombinedCRC != s->storedCombinedCRC)
               return BZ_DATA_ERROR;
            return r;
         }
         if (s->state != BZ_X_OUTPUT) return r;
      }
   }

   AssertH ( 0, 6001 );

   return 0;  /*NOTREACHED*/
}